

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglClientExtensionTests.cpp
# Opt level: O0

int __thiscall deqp::egl::ClientExtensionTests::init(ClientExtensionTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  ClientExtensionTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  egl::anon_unknown_0::BaseTest::BaseTest
            ((BaseTest *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  egl::anon_unknown_0::DisjointTest::DisjointTest
            ((DisjointTest *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  egl::anon_unknown_0::CheckExtensionsTest::CheckExtensionsTest
            ((CheckExtensionsTest *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void ClientExtensionTests::init (void)
{
	addChild(new BaseTest(m_eglTestCtx));
	addChild(new DisjointTest(m_eglTestCtx));
	addChild(new CheckExtensionsTest(m_eglTestCtx));
}